

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O0

int SUNNonlinSolFree_Newton(SUNNonlinearSolver NLS)

{
  long *in_RDI;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      if (*(long *)(*in_RDI + 0x20) != 0) {
        N_VDestroy((N_Vector)0xedac79);
      }
      *(undefined8 *)(*in_RDI + 0x20) = 0;
      free((void *)*in_RDI);
      *in_RDI = 0;
    }
    if (in_RDI[1] != 0) {
      free((void *)in_RDI[1]);
      in_RDI[1] = 0;
    }
    free(in_RDI);
  }
  return 0;
}

Assistant:

int SUNNonlinSolFree_Newton(SUNNonlinearSolver NLS)
{
  /* return if NLS is already free */
  if (NLS == NULL)
    return(SUN_NLS_SUCCESS);

  /* free items from contents, then the generic structure */
  if (NLS->content) {

    if (NEWTON_CONTENT(NLS)->delta)
      N_VDestroy(NEWTON_CONTENT(NLS)->delta);
    NEWTON_CONTENT(NLS)->delta = NULL;

    free(NLS->content);
    NLS->content = NULL;
  }

  /* free the ops structure */
  if (NLS->ops) {
    free(NLS->ops);
    NLS->ops = NULL;
  }

  /* free the nonlinear solver */
  free(NLS);

  return(SUN_NLS_SUCCESS);
}